

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_pairs.cpp
# Opt level: O2

void __thiscall Name_pairs::read_names(Name_pairs *this)

{
  int iVar1;
  long lVar2;
  string input;
  string local_90;
  string local_70;
  string local_50;
  
  std::operator<<((ostream *)&std::cout,"Enter list of names delimited with comma:\n");
  if (read_names()::delimeter_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&read_names()::delimeter_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&read_names()::delimeter_abi_cxx11_,",",(allocator<char> *)&local_90);
      __cxa_atexit(std::__cxx11::string::~string,&read_names()::delimeter_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&read_names()::delimeter_abi_cxx11_);
    }
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_90);
  while( true ) {
    lVar2 = std::__cxx11::string::find((string *)&local_90,0x1081a0);
    if (lVar2 == -1) break;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_90);
    trim(&local_70,&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::erase((ulong)&local_90,0);
  }
  if (local_90._M_string_length != 0) {
    trim(&local_70,&local_90);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void Name_pairs::read_names()
{
	std::cout << "Enter list of names delimited with comma:\n";
	static const std::string delimeter = ",";
	std::string input;
	std::getline(std::cin, input);
	size_t pos = 0;
	while ((pos = input.find(delimeter)) != std::string::npos)
	{
		name.push_back(trim(input.substr(0, pos)));
		input.erase(0, pos + 1);
	}
	// handle cases when there is one more name after delimiter
	if (!input.empty())
		name.push_back(trim(input));
}